

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  uint uVar1;
  int iVar2;
  uint __c;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 *puVar12;
  long lVar13;
  undefined1 *puVar14;
  void *__s;
  
  uVar10 = (ulong)(uint)left;
  uVar1 = dst->w;
  lVar11 = (long)(int)uVar1;
  iVar2 = dst->h;
  puVar12 = (undefined1 *)src->data;
  __s = dst->data;
  if (type == 0) {
    __c = (uint)(byte)v;
    iVar5 = top;
    if (top < 1) {
      iVar4 = 0;
    }
    else {
      do {
        if (0 < (int)uVar1) {
          memset(__s,__c,(ulong)uVar1);
        }
        __s = (void *)((long)__s + lVar11);
        iVar5 = iVar5 + -1;
        iVar4 = top;
      } while (iVar5 != 0);
    }
    if (iVar4 < src->h + top) {
      lVar13 = (long)left;
      uVar9 = 0;
      if (0 < left) {
        uVar9 = (ulong)(uint)left;
      }
      do {
        uVar7 = 0;
        if (0 < left) {
          memset(__s,__c,(ulong)(uint)left);
          uVar7 = (ulong)(uint)left;
        }
        if ((long)src->w < 0xc) {
          uVar8 = uVar9;
          if ((int)uVar7 < src->w + left) {
            do {
              *(undefined1 *)((long)__s + uVar8) = puVar12[uVar8 - lVar13];
              uVar7 = uVar8 + 1;
              uVar8 = uVar7;
            } while ((long)uVar7 < src->w + lVar13);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar13),puVar12,(long)src->w);
          uVar7 = (ulong)(uint)((int)uVar7 + src->w);
        }
        uVar6 = (uint)uVar7;
        if ((int)uVar6 < (int)uVar1) {
          memset((void *)((long)(int)uVar6 + (long)__s),__c,(ulong)(~uVar6 + uVar1) + 1);
        }
        puVar12 = puVar12 + src->w;
        __s = (void *)((long)__s + lVar11);
        iVar4 = iVar4 + 1;
      } while (iVar4 < src->h + top);
    }
    iVar5 = iVar2 - iVar4;
    if (iVar5 != 0 && iVar4 <= iVar2) {
      do {
        if (0 < (int)uVar1) {
          memset(__s,__c,(ulong)uVar1);
        }
        __s = (void *)((long)__s + lVar11);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  puVar14 = puVar12;
  if (type == 1) {
    if (top < 1) {
      iVar5 = 0;
    }
    else {
      lVar13 = (long)left;
      iVar4 = 0;
      do {
        uVar9 = 0;
        if (0 < left) {
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar12;
            uVar9 = uVar9 + 1;
          } while ((uint)left != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar12[uVar9 - lVar13];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar13);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar13),puVar12,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        if ((int)uVar9 < (int)uVar1) {
          lVar3 = (long)(int)uVar9;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar12[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar11 != lVar3);
        }
        __s = (void *)((long)__s + lVar11);
        iVar4 = iVar4 + 1;
        iVar5 = top;
      } while (iVar4 != top);
    }
    if (iVar5 < src->h + top) {
      lVar13 = (long)left;
      do {
        uVar9 = 0;
        if (0 < left) {
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar12;
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar12[uVar9 - lVar13];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar13);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar13),puVar12,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        if ((int)uVar9 < (int)uVar1) {
          lVar3 = (long)(int)uVar9;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar12[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar11 != lVar3);
        }
        puVar12 = puVar12 + src->w;
        __s = (void *)((long)__s + lVar11);
        iVar5 = iVar5 + 1;
      } while (iVar5 < src->h + top);
    }
    iVar4 = src->w;
    puVar14 = puVar12 + -(long)iVar4;
    if (iVar5 < iVar2) {
      lVar13 = (long)left;
      do {
        uVar9 = 0;
        if (0 < left) {
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar14;
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar12[uVar9 + (-lVar13 - (long)iVar4)];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar13);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar13),puVar14,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        if ((int)uVar9 < (int)uVar1) {
          lVar3 = (long)(int)uVar9;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar14[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar11 != lVar3);
        }
        __s = (void *)((long)__s + lVar11);
        iVar5 = iVar5 + 1;
      } while (iVar5 != iVar2);
    }
  }
  if (type == 2) {
    puVar14 = puVar14 + (long)top * (long)src->w;
    lVar13 = (long)left;
    if (top < 1) {
      iVar5 = 0;
    }
    else {
      iVar4 = 0;
      do {
        uVar9 = 0;
        if (0 < left) {
          puVar12 = puVar14 + lVar13;
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar12;
            uVar9 = uVar9 + 1;
            puVar12 = puVar12 + -1;
          } while (uVar10 != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar14[uVar9 - lVar13];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar13);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar13),puVar14,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        iVar5 = (int)uVar9;
        if (iVar5 < (int)uVar1) {
          lVar3 = (long)iVar5;
          iVar5 = (left + -2) - iVar5;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar14[iVar5 + src->w * 2];
            lVar3 = lVar3 + 1;
            iVar5 = iVar5 + -1;
          } while (lVar11 != lVar3);
        }
        __s = (void *)((long)__s + lVar11);
        puVar14 = puVar14 + -(long)src->w;
        iVar4 = iVar4 + 1;
        iVar5 = top;
      } while (iVar4 != top);
    }
    if (iVar5 < src->h + top) {
      do {
        uVar9 = 0;
        if (0 < left) {
          puVar12 = puVar14 + lVar13;
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar12;
            uVar9 = uVar9 + 1;
            puVar12 = puVar12 + -1;
          } while (uVar10 != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar14[uVar9 - lVar13];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar13);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar13),puVar14,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        iVar4 = (int)uVar9;
        if (iVar4 < (int)uVar1) {
          lVar3 = (long)iVar4;
          iVar4 = (left + -2) - iVar4;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar14[iVar4 + src->w * 2];
            lVar3 = lVar3 + 1;
            iVar4 = iVar4 + -1;
          } while (lVar11 != lVar3);
        }
        puVar14 = puVar14 + src->w;
        __s = (void *)((long)__s + lVar11);
        iVar5 = iVar5 + 1;
      } while (iVar5 < src->h + top);
    }
    if (iVar5 < iVar2) {
      puVar14 = puVar14 + (long)src->w * -2;
      do {
        uVar9 = 0;
        if (0 < left) {
          puVar12 = puVar14 + lVar13;
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar12;
            uVar9 = uVar9 + 1;
            puVar12 = puVar12 + -1;
          } while (uVar10 != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar14[uVar9 - lVar13];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar13);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar13),puVar14,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        iVar4 = (int)uVar9;
        if (iVar4 < (int)uVar1) {
          lVar3 = (long)iVar4;
          iVar4 = (left + -2) - iVar4;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar14[iVar4 + src->w * 2];
            lVar3 = lVar3 + 1;
            iVar4 = iVar4 + -1;
          } while (lVar11 != lVar3);
        }
        __s = (void *)((long)__s + lVar11);
        puVar14 = puVar14 + -(long)src->w;
        iVar5 = iVar5 + 1;
      } while (iVar5 != iVar2);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }

    if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }

    if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}